

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<int> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  ParamGenerator<int> PVar1;
  vector<int,_std::allocator<int>_> local_30;
  ValueArray<int,_int,_int,_int,_int,_int,_int> *this_local;
  
  this_local = (ValueArray<int,_int,_int,_int,_int,_int,_int> *)this;
  ValueArray<int,int,int,int,int,int,int>::MakeVector<int,0ul,1ul,2ul,3ul,4ul,5ul,6ul>
            (&local_30,in_RSI);
  ValuesIn<std::vector<int,std::allocator<int>>>((testing *)this,&local_30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_30);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<int>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }